

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGClient.cpp
# Opt level: O2

bool __thiscall
ViconCGStreamClientSDK::VCGClient::WaitFrames
          (VCGClient *this,
          vector<ViconCGStreamClientSDK::ICGFrameState,_std::allocator<ViconCGStreamClientSDK::ICGFrameState>_>
          *o_rFrames,uint i_TimeoutMs)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  undefined1 uVar4;
  scoped_lock Lock;
  xtime WaitDeadline;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&Lock,&this->m_ClientMutex);
  boost::xtime_get(&WaitDeadline,1);
  lVar3 = (long)((double)i_TimeoutMs / 1000.0);
  WaitDeadline.sec = WaitDeadline.sec + lVar3;
  WaitDeadline.nsec = WaitDeadline.nsec + (lVar3 * -1000 + (ulong)i_TimeoutMs) * 1000000;
  do {
    if ((this->m_FrameDeque).
        super__Deque_base<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        (this->m_FrameDeque).
        super__Deque_base<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      iVar2 = (*(this->super_ICGClient)._vptr_ICGClient[0x15])(this,o_rFrames);
      uVar4 = (undefined1)iVar2;
      goto LAB_00148ede;
    }
    bVar1 = boost::condition_variable_any::timed_wait<boost::unique_lock<boost::recursive_mutex>>
                      (&this->m_NewFramesCondition,&Lock,&WaitDeadline);
  } while (bVar1);
  uVar4 = 0;
LAB_00148ede:
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&Lock);
  return (bool)uVar4;
}

Assistant:

bool VCGClient::WaitFrames( std::vector< ICGFrameState > & o_rFrames, unsigned int i_TimeoutMs )
{
  boost::recursive_mutex::scoped_lock Lock( m_ClientMutex );

  boost::xtime WaitDeadline;

  // boost::TIME_UTC has been renamed to boost::TIME_UTC_ in Boost 1.50:
  // https://svn.boost.org/trac/boost/ticket/6940
#if BOOST_VERSION >= 105000
  boost::xtime_get( &WaitDeadline, boost::TIME_UTC_ );
#else
  boost::xtime_get( &WaitDeadline, boost::TIME_UTC );
#endif
  boost::xtime::xtime_sec_t  AdditionalSeconds     = static_cast< boost::xtime::xtime_sec_t  >( static_cast< double >( i_TimeoutMs ) / 1000.0 );
  boost::xtime::xtime_nsec_t AdditionalNanoSeconds = static_cast< boost::xtime::xtime_nsec_t >( ( i_TimeoutMs - ( 1000 * AdditionalSeconds ) ) * 1000000 );
 
  WaitDeadline.sec += AdditionalSeconds;
  WaitDeadline.nsec += AdditionalNanoSeconds;

  while( m_FrameDeque.empty() )
  {
    if( !m_NewFramesCondition.timed_wait( Lock, WaitDeadline ) )
    {
      return false;
    }
  }
  
  return PollFrames( o_rFrames );
}